

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O0

Float __thiscall pbrt::TabulatedBSSRDF::PDF_Sr(TabulatedBSSRDF *this,int ch,Float r)

{
  undefined1 auVar1 [16];
  span<float> weights;
  span<float> weights_00;
  bool bVar2;
  const_reference pvVar3;
  float *pfVar4;
  undefined4 in_ESI;
  span<const_float> *in_RDI;
  float in_XMM0_Da;
  Float FVar5;
  Float FVar6;
  size_t unaff_retaddr;
  span<const_float> in_stack_00000008;
  int j;
  int i;
  Float rhoEff;
  Float sr;
  Float radiusWeights [4];
  Float rhoWeights [4];
  int radiusOffset;
  int rhoOffset;
  Float rOptical;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  int local_98;
  int local_94;
  uint local_90;
  float local_8c;
  float local_48 [4];
  float local_38 [6];
  int local_20;
  float local_1c;
  float fVar7;
  span<const_float> *psVar8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  fVar7 = in_XMM0_Da;
  psVar8 = in_RDI;
  FVar5 = SampledSpectrum::operator[]
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c);
  FVar6 = (Float)((ulong)psVar8 >> 0x20);
  local_1c = in_XMM0_Da * FVar5;
  pstd::span<float_const>::
  span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
            (in_RDI,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                    CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff48));
  FVar5 = SampledSpectrum::operator[]
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c);
  pstd::span<float>::span<4ul>
            ((span<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (float (*) [4])CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  weights.ptr._4_4_ = in_stack_fffffffffffffffc;
  weights.ptr._0_4_ = in_stack_fffffffffffffff8;
  weights.n = unaff_retaddr;
  bVar2 = CatmullRomWeights(in_stack_00000008,FVar6,(int *)CONCAT44(in_ESI,fVar7),weights);
  if (bVar2) {
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              (in_RDI,(vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff48));
    pstd::span<float>::span<4ul>
              ((span<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (float (*) [4])CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    weights_00.ptr._4_4_ = in_stack_fffffffffffffffc;
    weights_00.ptr._0_4_ = in_stack_fffffffffffffff8;
    weights_00.n = unaff_retaddr;
    bVar2 = CatmullRomWeights(in_stack_00000008,FVar6,(int *)CONCAT44(in_ESI,fVar7),weights_00);
    if (bVar2) {
      local_8c = 0.0;
      local_90 = 0;
      for (local_94 = 0; local_94 < 4; local_94 = local_94 + 1) {
        if ((local_38[local_94] != 0.0) || (NAN(local_38[local_94]))) {
          pvVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                             ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                              (in_RDI[4].n + 0x60),(long)(local_20 + local_94));
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_38[local_94]),ZEXT416((uint)*pvVar3),
                                   ZEXT416(local_90));
          local_90 = auVar1._0_4_;
          for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
            if ((local_48[local_98] != 0.0) || (NAN(local_48[local_98]))) {
              FVar6 = BSSRDFTable::EvalProfile
                                ((BSSRDFTable *)
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                 (int)FVar5,in_stack_ffffffffffffff58);
              auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_48[local_98]),
                                       ZEXT416((uint)(FVar6 * local_38[local_94])),
                                       ZEXT416((uint)local_8c));
              local_8c = auVar1._0_4_;
            }
          }
        }
      }
      if ((local_1c != 0.0) || (NAN(local_1c))) {
        local_8c = local_8c / (local_1c * 6.2831855);
      }
      FVar5 = SampledSpectrum::operator[]
                        ((SampledSpectrum *)CONCAT44(in_stack_ffffffffffffff44,local_8c),
                         in_stack_ffffffffffffff3c);
      SampledSpectrum::operator[]
                ((SampledSpectrum *)CONCAT44(local_8c * FVar5,local_8c),in_stack_ffffffffffffff3c);
      pfVar4 = std::max<float>((float *)&stack0xffffffffffffff64,(float *)&stack0xffffffffffffff60);
      return *pfVar4;
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    Float PDF_Sr(int ch, Float r) const {
        // Convert $r$ into unitless optical radius $r_{\roman{optical}}$
        Float rOptical = r * sigma_t[ch];

        // Compute spline weights to interpolate BSSRDF density on channel _ch_
        int rhoOffset, radiusOffset;
        Float rhoWeights[4], radiusWeights[4];
        if (!CatmullRomWeights(table->rhoSamples, rho[ch], &rhoOffset, rhoWeights) ||
            !CatmullRomWeights(table->radiusSamples, rOptical, &radiusOffset,
                               radiusWeights))
            return 0.f;

        // Return BSSRDF profile density for channel _ch_
        Float sr = 0, rhoEff = 0;
        for (int i = 0; i < 4; ++i) {
            if (rhoWeights[i] == 0)
                continue;
            rhoEff += table->rhoEff[rhoOffset + i] * rhoWeights[i];
            for (int j = 0; j < 4; ++j) {
                if (radiusWeights[j] == 0)
                    continue;
                sr += table->EvalProfile(rhoOffset + i, radiusOffset + j) *
                      rhoWeights[i] * radiusWeights[j];
            }
        }
        // Cancel marginal PDF factor from tabulated BSSRDF profile
        if (rOptical != 0)
            sr /= 2 * Pi * rOptical;

        return std::max<Float>(0, sr * sigma_t[ch] * sigma_t[ch] / rhoEff);
    }